

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluatePerseusPolicy.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  ostream *poVar3;
  NullPlanner *this;
  QAV<PerseusBGPlanner> *this_00;
  ulong uVar4;
  AgentBG *this_01;
  QAV<PerseusPOMDPPlanner> *this_02;
  AgentPOMDP *this_03;
  StateDistribution *pSVar5;
  ulong uVar6;
  undefined8 *puVar7;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_> agents
  ;
  PlanningUnitMADPDiscreteParameters params;
  AgentDelayedSharedObservations *agent1;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  QAVParameters qavParams;
  Arguments args;
  stringstream valueFunction;
  AgentDelayedSharedObservations ***local_528;
  iterator iStack_520;
  AgentDelayedSharedObservations **local_518 [3];
  undefined1 local_500 [8];
  double local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  undefined8 local_4e0;
  undefined4 local_4d8;
  PlanningUnitMADPDiscreteParameters local_4c9 [7];
  undefined1 local_4c2;
  undefined1 local_4c1;
  AgentBG *local_4c0 [3];
  double local_4a8;
  ulong local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  vector<double,_std::allocator<double>_> local_490 [8];
  long local_488 [3];
  undefined4 local_470;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
  local_468 [3];
  undefined1 local_418 [141];
  undefined1 local_38b;
  BGIP_Solver_t local_388;
  GMAA_t local_378;
  char local_374;
  int local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [4];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ArgumentHandlers::Arguments::Arguments((Arguments *)(local_418 + 0x28));
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,local_418 + 0x28);
  Perseus::ProcessArguments((Arguments *)local_418);
  local_38b = 1;
  pDVar2 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)(local_418 + 0x28));
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_498 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"POMDP","");
  directories::MADPGetResultsFilename
            ((string *)local_468,(MultiAgentDecisionProcessInterface *)&local_498,
             (Arguments *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,
                      (char *)local_468[0].
                              super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_468[0].
                            super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Perseus",7);
  Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_500);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_500,(long)local_4f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ValueFunction_h",0xf);
  if (local_500 != (undefined1  [8])&local_4f0) {
    operator_delete((void *)local_500,local_4f0._M_allocated_capacity + 1);
  }
  if (local_468[0].
      super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_468[0].
                super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_468[0].
                    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468[0].
                          super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_498 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488) {
    operator_delete(local_498,local_488[0] + 1);
  }
  if (local_374 == '\x01') {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  else {
    std::ostream::operator<<(local_1a8,local_378);
  }
  local_4a0 = 999999;
  if (local_374 == '\0') {
    local_4a0 = (long)(int)local_378;
  }
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_4c9);
  PlanningUnitMADPDiscreteParameters::SetComputeAll((bool)((char)&local_4c1 + -8));
  local_4c2 = local_388 != BFS;
  local_4c1 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x140))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,local_4a0,pDVar2,local_4c9);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            ((SimulationDecPOMDPDiscrete *)local_468,(PlanningUnitDecPOMDPDiscrete *)this,
             (Arguments *)(local_418 + 0x28));
  SimulationResult::SimulationResult((SimulationResult *)&local_498);
  if (local_2d8 == 0) {
    local_528 = (AgentDelayedSharedObservations ***)0x0;
    iStack_520._M_current = (AgentDelayedSharedObservations **)0x0;
    local_518[0] = (AgentDelayedSharedObservations **)0x0;
    this_02 = (QAV<PerseusPOMDPPlanner> *)operator_new(0x38);
    std::__cxx11::stringbuf::str();
    QAV<PerseusPOMDPPlanner>::QAV(this_02,(PlanningUnitDecPOMDPDiscrete *)this,(string *)local_500);
    if (local_500 != (undefined1  [8])&local_4f0) {
      operator_delete((void *)local_500,local_4f0._M_allocated_capacity + 1);
    }
    uVar6 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)) + 0x10))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0x40));
      if (uVar4 == uVar6) break;
      this_03 = (AgentPOMDP *)operator_new(0x38);
      AgentPOMDP::AgentPOMDP(this_03,(PlanningUnitDecPOMDPDiscrete *)this,0,(QAV *)this_02);
      local_4c0[0] = (AgentBG *)this_03;
      (**(code **)(*(long *)this_03 + 0x18))(this_03,uVar6);
      if (iStack_520._M_current == local_518[0]) {
        std::vector<AgentSharedObservations*,std::allocator<AgentSharedObservations*>>::
        _M_realloc_insert<AgentSharedObservations*const&>
                  ((vector<AgentSharedObservations*,std::allocator<AgentSharedObservations*>> *)
                   &local_528,(iterator)iStack_520._M_current,(AgentSharedObservations **)local_4c0)
        ;
      }
      else {
        *iStack_520._M_current = (AgentDelayedSharedObservations *)local_4c0[0];
        iStack_520._M_current = iStack_520._M_current + 1;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentSharedObservations>
              ((SimulationDecPOMDPDiscrete *)local_500,
               (vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)
               local_468);
    local_498 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500;
    std::vector<double,_std::allocator<double>_>::operator=
              (local_490,(vector<double,_std::allocator<double>_> *)&local_4f8);
  }
  else {
    if (local_2d8 != 1) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "PerseusBackupType is unknown";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    local_528 = (AgentDelayedSharedObservations ***)0x0;
    iStack_520._M_current = (AgentDelayedSharedObservations **)0x0;
    local_518[0] = (AgentDelayedSharedObservations **)0x0;
    this_00 = (QAV<PerseusBGPlanner> *)operator_new(0x38);
    std::__cxx11::stringbuf::str();
    QAV<PerseusBGPlanner>::QAV(this_00,(PlanningUnitDecPOMDPDiscrete *)this,(string *)local_500);
    if (local_500 != (undefined1  [8])&local_4f0) {
      operator_delete((void *)local_500,local_4f0._M_allocated_capacity + 1);
    }
    uVar6 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)) + 0x10))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0x40));
      if (uVar4 == uVar6) break;
      this_01 = (AgentBG *)operator_new(0x100);
      AgentBG::AgentBG(this_01,(PlanningUnitDecPOMDPDiscrete *)this,0,(QAV *)this_00);
      local_4c0[0] = this_01;
      (**(code **)(*(long *)this_01 + 0x18))(this_01,uVar6);
      if (iStack_520._M_current == local_518[0]) {
        std::vector<AgentDelayedSharedObservations*,std::allocator<AgentDelayedSharedObservations*>>
        ::_M_realloc_insert<AgentDelayedSharedObservations*const&>
                  ((vector<AgentDelayedSharedObservations*,std::allocator<AgentDelayedSharedObservations*>>
                    *)&local_528,iStack_520,(AgentDelayedSharedObservations **)local_4c0);
      }
      else {
        *iStack_520._M_current = (AgentDelayedSharedObservations *)local_4c0[0];
        iStack_520._M_current = iStack_520._M_current + 1;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentDelayedSharedObservations>
              ((SimulationDecPOMDPDiscrete *)local_500,local_468);
    local_498 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500;
    std::vector<double,_std::allocator<double>_>::operator=
              (local_490,(vector<double,_std::allocator<double>_> *)&local_4f8);
  }
  local_470 = local_4d8;
  local_488[2] = local_4e0;
  SimulationResult::~SimulationResult((SimulationResult *)local_500);
  if (local_528 != (AgentDelayedSharedObservations ***)0x0) {
    operator_delete(local_528,(long)local_518[0] - (long)local_528);
  }
  if (local_418[0x1c] == '\x01') {
    pSVar5 = (StateDistribution *)
             (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x50))
                       (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    JointBelief::JointBelief((JointBelief *)local_500,pSVar5);
    lVar1 = *(long *)((long)local_500 + -0xb8);
    std::__cxx11::stringbuf::str();
    AlphaVectorPlanning::ImportValueFunction((string *)local_4c0);
    local_4a8 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((JointBelief *)local_500 + lVar1),
                                   (vector *)local_4c0);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_4c0);
  }
  else {
    pSVar5 = (StateDistribution *)
             (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x50))
                       (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    JointBelief::JointBelief((JointBelief *)local_500,pSVar5);
    lVar1 = *(long *)((long)local_500 + -0xb8);
    std::__cxx11::stringbuf::str();
    uVar6 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x68))
                      (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x30))
              (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    AlphaVectorPlanning::ImportValueFunction((string *)local_4c0,(ulong)&local_528,local_4a0,uVar6);
    local_4a8 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((JointBelief *)local_500 + lVar1),
                                   (vector *)local_4c0,0);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)local_4c0);
  }
  if (local_528 != local_518) {
    operator_delete(local_528,(long)local_518[0] + 1);
  }
  JointBelief::~JointBelief((JointBelief *)local_500);
  if ((int)local_418._40_4_ < 0) {
    poVar3 = std::ostream::_M_insert<double>((double)local_498);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::ostream::_M_insert<double>(local_4a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Empirical control quality (h ",0x1d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," backup ",8);
    Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_500);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)local_500,(long)local_4f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," V(jb0) ",8);
    poVar3 = std::ostream::_M_insert<double>(local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = ",4);
    poVar3 = std::ostream::_M_insert<double>((double)local_498);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_500 != (undefined1  [8])&local_4f0) {
      operator_delete((void *)local_500,local_4f0._M_allocated_capacity + 1);
    }
  }
  SimulationResult::~SimulationResult((SimulationResult *)&local_498);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete((SimulationDecPOMDPDiscrete *)local_468);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_4c9);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0]._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    QAVParameters qavParams=Perseus::ProcessArguments(args);

    // this is necessary for running Perseus on TOI models
    args.cache_flat_models=true;

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream valueFunction;
    valueFunction << directories::MADPGetResultsFilename("POMDP",*decpomdp,args)
                  << "Perseus"
                  << Perseus::BackupTypeToString(qavParams) 
                  << "ValueFunction_h";
    if(args.infiniteHorizon)
        valueFunction << MAXHORIZON;
    else
        valueFunction << args.horizon;

    size_t horizon;
    if(!args.infiniteHorizon)
    {
        horizon=args.horizon;
//         if(qavParams.stationary && !args.isTOI)
//             decpomdp->ConvertFiniteToInfiniteHorizon(horizon);
    }
    else
        horizon=MAXHORIZON;
   

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    params.SetEventObservability(decpomdp->GetEventObservability());

    PlanningUnitDecPOMDPDiscrete *np=new NullPlanner(horizon,decpomdp, &params);

    SimulationDecPOMDPDiscrete sim(*np,args);
    SimulationResult result;

    switch(args.backup)
    {
    case POMDP:
    {
        vector<AgentSharedObservations*> agents;
        AgentSharedObservations *agent1;
        QAV<PerseusPOMDPPlanner> *Qpomdp=
            new QAV<PerseusPOMDPPlanner>(np,valueFunction.str());
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentPOMDP(np,0,Qpomdp);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    case BG:
    {
        vector<AgentDelayedSharedObservations*> agents;
        QAV<PerseusBGPlanner> *Qbg=
            new QAV<PerseusBGPlanner>(np,valueFunction.str());
        AgentDelayedSharedObservations *agent1;
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentBG(np,0,Qbg);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    default:
        throw("PerseusBackupType is unknown");
    }

    double Vjb0;
    if(qavParams.stationary)
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str()));
    else
    {
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str(),
                                                      horizon, decpomdp->
                                                      GetNrJointActions(),
                                                      decpomdp->
                                                      GetNrStates()),
                                  0);
    }
    if(args.verbose < 0)
        cout << result.GetAvgReward() << " " << Vjb0 << endl;
    else
    {
        cout << "Empirical control quality (h " << horizon << " backup "
             << Perseus::BackupTypeToString(qavParams)
             << " V(jb0) " << Vjb0 << ") = " << result.GetAvgReward() << endl;
    }

    }
    catch(E& e){ e.Print(); }

    return(0);
}